

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_parser.c
# Opt level: O0

MPP_RET av1d_paser_reset(Av1CodecContext *ctx)

{
  void *pvVar1;
  AV1Frame *f;
  AV1Context *s;
  RK_U32 i;
  MPP_RET ret;
  Av1CodecContext *ctx_local;
  
  pvVar1 = ctx->priv_data;
  if ((av1d_debug & 1) != 0) {
    _mpp_log_l(4,"av1d_parser","enter ctx %p\n","av1d_paser_reset",ctx);
  }
  for (s._0_4_ = 0; (uint)s < 8; s._0_4_ = (uint)s + 1) {
    if (*(long *)((long)pvVar1 + (ulong)(uint)s * 0x2f8 + 0x398) != 0) {
      av1d_frame_unref(ctx,(AV1Frame *)((long)pvVar1 + (ulong)(uint)s * 0x2f8 + 0xa8));
    }
  }
  if (*(long *)((long)pvVar1 + 7000) != 0) {
    av1d_frame_unref(ctx,(AV1Frame *)((long)pvVar1 + 0x1868));
  }
  ctx->frame_header = 0;
  ctx->stream_offset = 0;
  ctx->eos = 0;
  if ((av1d_debug & 1) != 0) {
    _mpp_log_l(4,"av1d_parser","leave ctx %p\n","av1d_paser_reset",ctx);
  }
  return MPP_OK;
}

Assistant:

MPP_RET av1d_paser_reset(Av1CodecContext *ctx)
{
    (void)ctx;
    MPP_RET ret = MPP_OK;
    RK_U32 i = 0;
    AV1Context *s = ctx->priv_data;

    av1d_dbg_func("enter ctx %p\n", ctx);
    for ( i = 0; i < MPP_ARRAY_ELEMS(s->ref); i++) {
        AV1Frame *f = &s->ref[i];

        if (f->ref)
            av1d_frame_unref(ctx, &s->ref[i]);
    }

    if (s->cur_frame.ref) {
        av1d_frame_unref(ctx, &s->cur_frame);
    }

    ctx->frame_header = 0;
    ctx->stream_offset = 0;
    ctx->eos = 0;

    av1d_dbg_func("leave ctx %p\n", ctx);
    return ret;

}